

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O3

CompilationOptions * __thiscall slang::Bag::insertOrGet<slang::ast::CompilationOptions>(Bag *this)

{
  long lVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  char *__s2;
  uint uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  CompilationOptions *pCVar11;
  value_type_pointer ppVar12;
  ulong pos0;
  ulong uVar13;
  ulong uVar14;
  ulong hash;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  locator res;
  try_emplace_args_t local_a9;
  type_index local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  size_t local_80;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
  *local_78;
  value_type_pointer local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_a8._M_target = (type_info *)&ast::CompilationOptions::typeinfo;
  sVar10 = std::type_info::hash_code((type_info *)&ast::CompilationOptions::typeinfo);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar10;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->items).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar3 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_;
  lVar1 = (hash & 0xff) * 4;
  uVar18 = (&UNK_0092f4ac)[lVar1];
  uVar19 = (&UNK_0092f4ad)[lVar1];
  uVar20 = (&UNK_0092f4ae)[lVar1];
  bVar21 = (&UNK_0092f4af)[lVar1];
  ppVar4 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  uVar16 = (uint)hash;
  sVar10 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_size_mask;
  uVar14 = 0;
  uVar15 = pos0;
  uVar22 = uVar18;
  uVar23 = uVar19;
  uVar24 = uVar20;
  bVar25 = bVar21;
  uVar26 = uVar18;
  uVar27 = uVar19;
  uVar28 = uVar20;
  bVar29 = bVar21;
  uVar30 = uVar18;
  uVar31 = uVar19;
  uVar32 = uVar20;
  bVar33 = bVar21;
  do {
    pgVar2 = pgVar3 + uVar15;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar7 = pgVar2->m[0xf].n;
    auVar17[0] = -(local_58 == uVar18);
    auVar17[1] = -(uStack_57 == uVar19);
    auVar17[2] = -(uStack_56 == uVar20);
    auVar17[3] = -(bStack_55 == bVar21);
    auVar17[4] = -(uStack_54 == uVar22);
    auVar17[5] = -(uStack_53 == uVar23);
    auVar17[6] = -(uStack_52 == uVar24);
    auVar17[7] = -(bStack_51 == bVar25);
    auVar17[8] = -(uStack_50 == uVar26);
    auVar17[9] = -(uStack_4f == uVar27);
    auVar17[10] = -(uStack_4e == uVar28);
    auVar17[0xb] = -(bStack_4d == bVar29);
    auVar17[0xc] = -(uStack_4c == uVar30);
    auVar17[0xd] = -(uStack_4b == uVar31);
    auVar17[0xe] = -(uStack_4a == uVar32);
    auVar17[0xf] = -(bVar7 == bVar33);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    uVar13 = uVar14;
    bStack_49 = bVar7;
    if (uVar9 != 0) {
      local_70 = ppVar4 + uVar15 * 0xf;
      do {
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        ppVar12 = local_70 + uVar5;
        __s2 = *(char **)((ppVar12->first)._M_target + 8);
        if (__s2 == "N5slang3ast18CompilationOptionsE") goto LAB_0086805a;
        local_a0 = pos0;
        local_98 = uVar15;
        local_90 = hash;
        local_88 = uVar14;
        local_80 = sVar10;
        local_78 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                    *)this;
        local_68 = uVar18;
        uStack_67 = uVar19;
        uStack_66 = uVar20;
        bStack_65 = bVar21;
        uStack_64 = uVar22;
        uStack_63 = uVar23;
        uStack_62 = uVar24;
        bStack_61 = bVar25;
        uStack_60 = uVar26;
        uStack_5f = uVar27;
        uStack_5e = uVar28;
        bStack_5d = bVar29;
        uStack_5c = uVar30;
        uStack_5b = uVar31;
        uStack_5a = uVar32;
        bStack_59 = bVar33;
        iVar8 = strcmp("N5slang3ast18CompilationOptionsE",__s2);
        if (iVar8 == 0) goto LAB_0086805a;
        uVar9 = uVar9 - 1 & uVar9;
        this = (Bag *)local_78;
        pos0 = local_a0;
        sVar10 = local_80;
        uVar13 = local_88;
        uVar14 = local_88;
        hash = local_90;
        uVar15 = local_98;
        uVar18 = local_68;
        uVar19 = uStack_67;
        uVar20 = uStack_66;
        bVar21 = bStack_65;
        uVar22 = uStack_64;
        uVar23 = uStack_63;
        uVar24 = uStack_62;
        bVar25 = bStack_61;
        uVar26 = uStack_60;
        uVar27 = uStack_5f;
        uVar28 = uStack_5e;
        bVar29 = bStack_5d;
        uVar30 = uStack_5c;
        uVar31 = uStack_5b;
        uVar32 = uStack_5a;
        bVar33 = bStack_59;
      } while (uVar9 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar16 & 7] & bVar7) == 0) break;
    uVar14 = uVar13 + 1;
    uVar15 = uVar15 + uVar13 + 1 & sVar10;
  } while (uVar14 <= sVar10);
  if (*(ulong *)((long)this + 0x28) < *(ulong *)((long)this + 0x20)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,(arrays_type *)this,pos0,hash,&local_a9,&local_a8);
    *(long *)((long)this + 0x28) = *(long *)((long)this + 0x28) + 1;
    ppVar12 = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,hash,&local_a9,&local_a8);
    ppVar12 = local_48.p;
  }
LAB_0086805a:
  if ((ppVar12->second)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    std::any::
    __do_emplace<slang::ast::CompilationOptions,,std::any::_Manager_external<slang::ast::CompilationOptions>>
              (&ppVar12->second);
  }
  pCVar11 = (CompilationOptions *)
            std::__any_caster<slang::ast::CompilationOptions>(&ppVar12->second);
  return pCVar11;
}

Assistant:

T& insertOrGet() {
        auto& item = items[SLANG_TYPEOF(T)];
        if (!item.has_value())
            item.template emplace<T>();
        return *std::any_cast<T>(&item);
    }